

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

type_conflict4 __thiscall
jsoncons::basic_staj_event<char>::get_<unsigned_int,std::allocator<char>>
          (void *param_1,undefined8 param_2,undefined8 param_3)

{
  bool bVar1;
  char *pcVar2;
  to_integer_errc tVar3;
  type tVar4;
  char *unaff_retaddr;
  type result;
  uint val;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  char *local_38;
  to_integer_errc local_30;
  uint local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_20 = param_3;
  local_18 = param_2;
  switch(*param_1) {
  case 1:
    tVar4 = detail::to_integer<unsigned_int,char>
                      (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (uint *)param_1);
    pcVar2 = tVar4.ptr;
    tVar3 = tVar4.ec;
    local_38 = pcVar2;
    local_30 = tVar3;
    bVar1 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_38);
    if (!bVar1) {
      std::error_code::operator=
                ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,tVar3),
                 (conv_errc)((ulong)pcVar2 >> 0x20));
      local_24 = 0;
    }
    break;
  default:
    std::error_code::operator=
              ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
               (conv_errc)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_24 = 0;
    break;
  case 4:
    local_24 = (uint)((*(byte *)((long)param_1 + 0x10) & 1) != 0);
    break;
  case 5:
    local_24 = (uint)*(undefined8 *)((long)param_1 + 0x10);
    break;
  case 6:
    local_24 = (uint)*(undefined8 *)((long)param_1 + 0x10);
    break;
  case 8:
    local_24 = (uint)*(ushort *)((long)param_1 + 0x10);
    break;
  case 9:
    local_24 = (uint)(long)*(double *)((long)param_1 + 0x10);
  }
  return local_24;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<IntegerType>::value, IntegerType>::type
    get_(Allocator, std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::string_value:
            {
                IntegerType val;
                auto result = jsoncons::detail::to_integer(value_.string_data_, length_, val);
                if (!result)
                {
                    ec = conv_errc::not_integer;
                    return IntegerType();
                }
                return val;
            }
            case staj_event_type::half_value:
                return static_cast<IntegerType>(value_.half_value_);
            case staj_event_type::double_value:
                return static_cast<IntegerType>(value_.double_value_);
            case staj_event_type::int64_value:
                return static_cast<IntegerType>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<IntegerType>(value_.uint64_value_);
            case staj_event_type::bool_value:
                return static_cast<IntegerType>(value_.bool_value_ ? 1 : 0);
            default:
                ec = conv_errc::not_integer;
                return IntegerType();
        }
    }